

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O0

string * pbrt::ReadFileContents(string *filename)

{
  byte bVar1;
  int errorId;
  string *in_RSI;
  string *in_RDI;
  ifstream ifs;
  istreambuf_iterator<char,_std::char_traits<char>_> *in_stack_fffffffffffffd70;
  undefined4 in_stack_fffffffffffffd78;
  undefined4 in_stack_fffffffffffffd7c;
  string *this;
  allocator<char> local_269 [9];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffda0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffda8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdb0;
  istreambuf_iterator<char,_std::char_traits<char>_> in_stack_fffffffffffffdb8;
  istreambuf_iterator<char,_std::char_traits<char>_> in_stack_fffffffffffffdc8;
  long local_218 [67];
  
  this = in_RDI;
  std::ifstream::ifstream(local_218,in_RSI,_S_bin);
  bVar1 = std::ios::operator!((ios *)((long)local_218 + *(long *)(local_218[0] + -0x18)));
  if ((bVar1 & 1) == 0) {
    std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
              ((istreambuf_iterator<char,_std::char_traits<char>_> *)this,
               (istream_type *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
    std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
              (in_stack_fffffffffffffd70);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::istreambuf_iterator<char,std::char_traits<char>>,void>
              (in_stack_fffffffffffffdb0,in_stack_fffffffffffffdc8,in_stack_fffffffffffffdb8,
               (allocator<char> *)in_stack_fffffffffffffda8);
    std::allocator<char>::~allocator(local_269);
    std::ifstream::~ifstream(local_218);
    return in_RDI;
  }
  errorId = LastError();
  ErrorString_abi_cxx11_(errorId);
  ErrorExit<std::__cxx11::string_const&,std::__cxx11::string>
            ((char *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
}

Assistant:

std::string ReadFileContents(const std::string &filename) {
    std::ifstream ifs(filename, std::ios::binary);
    if (!ifs)
        ErrorExit("%s: %s", filename, ErrorString());
    return std::string((std::istreambuf_iterator<char>(ifs)),
                       (std::istreambuf_iterator<char>()));
}